

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O3

EVP_MD * cbs_to_md(CBS *cbs)

{
  int iVar1;
  EVP_MD *pEVar2;
  long lVar3;
  size_t in_RSI;
  long lVar4;
  
  lVar4 = 0;
  while ((kMDOIDs[0].oid[lVar4 + 9] != in_RSI ||
         ((kMDOIDs[0].oid[lVar4 + 9] != 0 &&
          (iVar1 = bcmp(cbs,kMDOIDs[0].oid + lVar4,in_RSI), iVar1 != 0))))) {
    lVar4 = lVar4 + 0x10;
    if (lVar4 == 0x70) {
      return (EVP_MD *)0x0;
    }
  }
  if (*(int *)(kMDOIDs[0].oid + lVar4 + 0xc) == 0) {
    return (EVP_MD *)0x0;
  }
  lVar3 = 8;
  do {
    if (*(int *)(&UNK_0023c858 + lVar3) == *(int *)(kMDOIDs[0].oid + lVar4 + 0xc)) {
      pEVar2 = (EVP_MD *)(**(code **)((long)&nid_to_digest_mapping[0].nid + lVar3))();
      return pEVar2;
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x248);
  return (EVP_MD *)0x0;
}

Assistant:

static const EVP_MD *cbs_to_md(const CBS *cbs) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kMDOIDs); i++) {
    if (CBS_len(cbs) == kMDOIDs[i].oid_len &&
        OPENSSL_memcmp(CBS_data(cbs), kMDOIDs[i].oid, kMDOIDs[i].oid_len) ==
            0) {
      return EVP_get_digestbynid(kMDOIDs[i].nid);
    }
  }

  return NULL;
}